

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detonation_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Detonation_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Detonation_PDU *this)

{
  pointer pKVar1;
  ostream *poVar2;
  KINT32 Value;
  ulong uVar3;
  char cVar4;
  pointer pKVar5;
  KString local_400;
  KString local_3e0;
  KString local_3c0;
  KString local_3a0;
  string local_380 [32];
  KString local_360;
  undefined1 local_340 [392];
  KStringStream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  Header7::GetAsString_abi_cxx11_((KString *)local_340,(Header7 *)this);
  poVar2 = std::operator<<(local_1a8,(string *)local_340);
  poVar2 = std::operator<<(poVar2,"-Detonation PDU-\n");
  Warfare_Header::GetAsString_abi_cxx11_(&local_3e0,&this->super_Warfare_Header);
  poVar2 = std::operator<<(poVar2,(string *)&local_3e0);
  poVar2 = std::operator<<(poVar2,"Velocity:                 ");
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_400,&this->m_Velocity);
  poVar2 = std::operator<<(poVar2,(string *)&local_400);
  poVar2 = std::operator<<(poVar2,"World Location:           ");
  DATA_TYPE::WorldCoordinates::GetAsString_abi_cxx11_(&local_360,&this->m_LocationWorldCoords);
  poVar2 = std::operator<<(poVar2,(string *)&local_360);
  (*(((this->m_pDescriptor).m_pRef)->super_DataTypeBase)._vptr_DataTypeBase[2])(local_380);
  poVar2 = std::operator<<(poVar2,local_380);
  poVar2 = std::operator<<(poVar2,"Entity Location:          ");
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_3a0,&this->m_LocationEntityCoords);
  poVar2 = std::operator<<(poVar2,(string *)&local_3a0);
  poVar2 = std::operator<<(poVar2,"Detonation Result:        ");
  DATA_TYPE::ENUMS::GetEnumAsStringDetonationResult_abi_cxx11_
            (&local_3c0,(ENUMS *)(ulong)this->m_ui8DetonationResult,Value);
  poVar2 = std::operator<<(poVar2,(string *)&local_3c0);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Num Articulation Params:  ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8NumOfVariableParams);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string(local_380);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)local_340);
  pKVar1 = (this->m_vVariableParameters).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  poVar2 = (ostream *)(local_340 + 0x10);
  for (pKVar5 = (this->m_vVariableParameters).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar5 != pKVar1; pKVar5 = pKVar5 + 1) {
    (*(pKVar5->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_400);
    std::__cxx11::stringstream::stringstream((stringstream *)local_340);
    std::operator<<(poVar2,'\t');
    uVar3 = 0;
    while( true ) {
      uVar3 = uVar3 & 0xffff;
      if (local_400._M_string_length <= uVar3) break;
      cVar4 = local_400._M_dataplus._M_p[uVar3];
      if (local_400._M_string_length - 1 != uVar3 && cVar4 == '\n') {
        cVar4 = '\t';
        std::operator<<(poVar2,'\n');
      }
      std::operator<<(poVar2,cVar4);
      uVar3 = (ulong)((int)uVar3 + 1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::operator<<(local_1a8,(string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_400);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

KString Detonation_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Detonation PDU-\n"
       << Warfare_Header::GetAsString()
       << "Velocity:                 " << m_Velocity.GetAsString()
       << "World Location:           " << m_LocationWorldCoords.GetAsString()
       << m_pDescriptor->GetAsString()
       << "Entity Location:          " << m_LocationEntityCoords.GetAsString()
       << "Detonation Result:        " << GetEnumAsStringDetonationResult( m_ui8DetonationResult ) << "\n"
       << "Num Articulation Params:  " << ( KUINT16 )m_ui8NumOfVariableParams
       << "\n";

    // Add the articulated parts
    vector<VarPrmPtr>::const_iterator citr = m_vVariableParameters.begin();
    vector<VarPrmPtr>::const_iterator citrEnd = m_vVariableParameters.end();
    for( ; citr != citrEnd; ++ citr )
    {
        ss << IndentString( ( *citr )->GetAsString(), 1 );
    }

    return ss.str();
}